

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleStringCollection::allocate(SimpleStringCollection *this,size_t _size)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffff68;
  SimpleString *in_stack_ffffffffffffff70;
  long *local_70;
  
  lVar1 = *in_RDI;
  if (lVar1 != 0) {
    for (lVar2 = lVar1 + *(long *)(lVar1 + -8) * 0x10; lVar1 != lVar2; lVar2 = lVar2 + -0x10) {
      SimpleString::~SimpleString((SimpleString *)0x171ae3);
    }
    operator_delete__(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  }
  in_RDI[3] = in_RSI;
  lVar1 = in_RDI[3];
  plVar3 = (long *)operator_new__((size_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                  0x171b5e);
  *plVar3 = lVar1;
  plVar3 = plVar3 + 1;
  if (lVar1 != 0) {
    local_70 = plVar3;
    do {
      SimpleString::SimpleString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_70 = local_70 + 2;
    } while (local_70 != plVar3 + lVar1 * 2);
  }
  *in_RDI = (long)plVar3;
  return;
}

Assistant:

void SimpleStringCollection::allocate(size_t _size)
{
    delete[] collection_;

    size_ = _size;
    collection_ = new SimpleString[size_];
}